

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_decoder.cc
# Opt level: O2

bool __thiscall draco::MetadataDecoder::DecodeEntry(MetadataDecoder *this,Metadata *metadata)

{
  bool bVar1;
  ulong __n;
  uint32_t data_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> entry_value;
  string entry_name;
  allocator_type local_55;
  uint local_54;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  bVar1 = DecodeName(this,&local_38);
  if (bVar1) {
    local_54 = 0;
    bVar1 = DecodeVarint<unsigned_int>(&local_54,this->buffer_);
    if (((bVar1) && (__n = (ulong)local_54, __n != 0)) &&
       ((long)__n <= this->buffer_->data_size_ - this->buffer_->pos_)) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50,__n,&local_55);
      bVar1 = DecoderBuffer::Decode
                        (this->buffer_,local_50._M_impl.super__Vector_impl_data._M_start,
                         (ulong)local_54);
      if (bVar1) {
        Metadata::AddEntryBinary
                  (metadata,&local_38,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50);
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
      goto LAB_0012f38c;
    }
  }
  bVar1 = false;
LAB_0012f38c:
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool MetadataDecoder::DecodeEntry(Metadata *metadata) {
  std::string entry_name;
  if (!DecodeName(&entry_name)) {
    return false;
  }
  uint32_t data_size = 0;
  if (!DecodeVarint(&data_size, buffer_)) {
    return false;
  }
  if (data_size == 0) {
    return false;
  }
  if (data_size > buffer_->remaining_size()) {
    return false;
  }
  std::vector<uint8_t> entry_value(data_size);
  if (!buffer_->Decode(&entry_value[0], data_size)) {
    return false;
  }
  metadata->AddEntryBinary(entry_name, entry_value);
  return true;
}